

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O0

int SUNLinSolSetup_Dense(SUNLinearSolver S,SUNMatrix A)

{
  sunrealtype **ppsVar1;
  sunindextype sVar2;
  sunindextype sVar3;
  undefined8 uVar4;
  SUNMatrix in_RSI;
  long *in_RDI;
  sunindextype *pivots;
  sunrealtype **A_cols;
  SUNContext_conflict sunctx_local_scope_;
  undefined4 local_4;
  
  ppsVar1 = SUNDenseMatrix_Cols(in_RSI);
  uVar4 = *(undefined8 *)(*in_RDI + 8);
  sVar2 = SUNDenseMatrix_Rows(in_RSI);
  sVar3 = SUNDenseMatrix_Columns(in_RSI);
  uVar4 = SUNDlsMat_denseGETRF(ppsVar1,sVar2,sVar3,uVar4);
  *(undefined8 *)(*in_RDI + 0x10) = uVar4;
  if (*(long *)(*in_RDI + 0x10) < 1) {
    local_4 = 0;
  }
  else {
    local_4 = 0x328;
  }
  return local_4;
}

Assistant:

int SUNLinSolSetup_Dense(SUNLinearSolver S, SUNMatrix A)
{
  SUNFunctionBegin(S->sunctx);
  sunrealtype** A_cols;
  sunindextype* pivots;

  SUNAssert(A, SUN_ERR_ARG_CORRUPT);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);

  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  pivots = NULL;
  A_cols = SUNDenseMatrix_Cols(A);
  pivots = PIVOTS(S);
  SUNAssert(pivots, SUN_ERR_ARG_CORRUPT);
  SUNAssert(A_cols, SUN_ERR_ARG_CORRUPT);

  /* perform LU factorization of input matrix */
  LASTFLAG(S) = SUNDlsMat_denseGETRF(A_cols, SUNDenseMatrix_Rows(A),
                                     SUNDenseMatrix_Columns(A), pivots);

  /* store error flag (if nonzero, this row encountered zero-valued pivod) */
  if (LASTFLAG(S) > 0) { return (SUNLS_LUFACT_FAIL); }
  return SUN_SUCCESS;
}